

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O3

void __thiscall
xsettingsd::SettingsManager::SetPropertyOnWindow
          (SettingsManager *this,Window win,char *data,size_t size)

{
  XChangeProperty(this->display_,win,this->prop_atom_,this->prop_atom_,8,0,data,size);
  return;
}

Assistant:

void SettingsManager::SetPropertyOnWindow(
    Window win, const char* data, size_t size) {
  XChangeProperty(display_,
                  win,
                  prop_atom_,  // property
                  prop_atom_,  // type
                  8,           // format (bits per element)
                  PropModeReplace,
                  reinterpret_cast<const unsigned char*>(data),
                  size);
}